

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3Snippet(sqlite3_context *pCtx,Fts3Cursor *pCsr,char *zStart,char *zEnd,
                       char *zEllipsis,int iCol,int nToken)

{
  uint uVar1;
  int iVar2;
  _func_void_void_ptr *in_RCX;
  long *in_RSI;
  sqlite3_context *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int iS;
  SnippetFragment sF;
  SnippetFragment *pFragment;
  int iRead;
  int iBestScore;
  u64 mSeen;
  u64 mCovered;
  int iSnip;
  int nFToken;
  SnippetFragment aSnippet [4];
  int nSnippet;
  StrBuffer res;
  int i;
  int rc;
  Fts3Table *pTab;
  _func_void_void_ptr *in_stack_fffffffffffffee8;
  sqlite3_context *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  int local_d8;
  int local_d4;
  SnippetFragment *local_d0;
  SnippetFragment *pFragment_00;
  int iVar3;
  u64 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  Fts3Cursor *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  SnippetFragment *in_stack_ffffffffffffff70;
  Fts3Cursor *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  StrBuffer *in_stack_ffffffffffffffa0;
  int local_54;
  char local_50 [16];
  int local_40;
  int local_3c;
  long local_38;
  int local_2c;
  sqlite3_context *local_28;
  _func_void_void_ptr *local_20;
  long *local_10;
  
  local_38 = *in_RSI;
  local_3c = 0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  memset(local_50,0,0x10);
  if (local_10[3] == 0) {
    sqlite3_result_text((sqlite3_context *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                        in_stack_fffffffffffffee8);
  }
  else {
    local_54 = 1;
    while( true ) {
      pFragment_00 = (SnippetFragment *)0x0;
      local_d0 = (SnippetFragment *)0x0;
      if (in_stack_00000008 < 0) {
        iVar2 = -in_stack_00000008;
      }
      else {
        iVar2 = (in_stack_00000008 + local_54 + -1) / local_54;
      }
      for (iVar3 = 0; iVar3 < local_54; iVar3 = iVar3 + 1) {
        local_d4 = -1;
        local_e0 = (undefined8 *)(&stack0xffffffffffffff48 + (long)iVar3 * 0x18);
        memset(local_e0,0,0x18);
        for (local_d8 = 0; local_d8 < *(int *)(local_38 + 0x30); local_d8 = local_d8 + 1) {
          memset(&local_f8,0,0x18);
          in_stack_ffffffffffffff04 = 0;
          if ((local_2c < 0) || (local_d8 == local_2c)) {
            in_stack_fffffffffffffee8 = (_func_void_void_ptr *)&stack0xffffffffffffff04;
            local_3c = fts3BestSnippet(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                       in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                                       (u64 *)CONCAT44(iVar2,iVar3),pFragment_00,
                                       &in_stack_ffffffffffffff70->iCol);
            if (local_3c != 0) goto LAB_001cd843;
            if (local_d4 < in_stack_ffffffffffffff04) {
              *local_e0 = local_f8;
              local_e0[1] = local_f0;
              local_e0[2] = local_e8;
              local_d4 = in_stack_ffffffffffffff04;
            }
          }
        }
        pFragment_00 = (SnippetFragment *)(local_e0[1] | (ulong)pFragment_00);
      }
      if ((local_d0 == pFragment_00) || (local_54 == 4)) break;
      local_54 = local_54 + 1;
    }
    local_40 = 0;
    while( true ) {
      uVar1 = in_stack_ffffffffffffff00 & 0xffffff;
      if (local_40 < local_54) {
        uVar1 = CONCAT13(local_3c == 0,(int3)in_stack_ffffffffffffff00);
      }
      in_stack_ffffffffffffff00 = uVar1;
      if ((char)(in_stack_ffffffffffffff00 >> 0x18) == '\0') break;
      in_stack_fffffffffffffef8 = local_50;
      in_stack_fffffffffffffee8 = local_20;
      in_stack_fffffffffffffef0 = local_28;
      local_3c = fts3SnippetText(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff64,(char *)in_stack_ffffffffffffff58,
                                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                                 in_stack_ffffffffffffffa0);
      local_40 = local_40 + 1;
    }
LAB_001cd843:
    sqlite3Fts3SegmentsClose((Fts3Table *)0x1cd850);
    if (local_3c == 0) {
      sqlite3_result_text((sqlite3_context *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                          in_stack_fffffffffffffee8);
    }
    else {
      sqlite3_result_error_code
                (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      sqlite3_free((void *)0x1cd87b);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3Snippet(
  sqlite3_context *pCtx,          /* SQLite function call context */
  Fts3Cursor *pCsr,               /* Cursor object */
  const char *zStart,             /* Snippet start text - "<b>" */
  const char *zEnd,               /* Snippet end text - "</b>" */
  const char *zEllipsis,          /* Snippet ellipsis text - "<b>...</b>" */
  int iCol,                       /* Extract snippet from this column */
  int nToken                      /* Approximate number of tokens in snippet */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;
  int i;
  StrBuffer res = {0, 0, 0};

  /* The returned text includes up to four fragments of text extracted from
  ** the data in the current row. The first iteration of the for(...) loop
  ** below attempts to locate a single fragment of text nToken tokens in 
  ** size that contains at least one instance of all phrases in the query
  ** expression that appear in the current row. If such a fragment of text
  ** cannot be found, the second iteration of the loop attempts to locate
  ** a pair of fragments, and so on.
  */
  int nSnippet = 0;               /* Number of fragments in this snippet */
  SnippetFragment aSnippet[4];    /* Maximum of 4 fragments per snippet */
  int nFToken = -1;               /* Number of tokens in each fragment */

  if( !pCsr->pExpr ){
    sqlite3_result_text(pCtx, "", 0, SQLITE_STATIC);
    return;
  }

  for(nSnippet=1; 1; nSnippet++){

    int iSnip;                    /* Loop counter 0..nSnippet-1 */
    u64 mCovered = 0;             /* Bitmask of phrases covered by snippet */
    u64 mSeen = 0;                /* Bitmask of phrases seen by BestSnippet() */

    if( nToken>=0 ){
      nFToken = (nToken+nSnippet-1) / nSnippet;
    }else{
      nFToken = -1 * nToken;
    }

    for(iSnip=0; iSnip<nSnippet; iSnip++){
      int iBestScore = -1;        /* Best score of columns checked so far */
      int iRead;                  /* Used to iterate through columns */
      SnippetFragment *pFragment = &aSnippet[iSnip];

      memset(pFragment, 0, sizeof(*pFragment));

      /* Loop through all columns of the table being considered for snippets.
      ** If the iCol argument to this function was negative, this means all
      ** columns of the FTS3 table. Otherwise, only column iCol is considered.
      */
      for(iRead=0; iRead<pTab->nColumn; iRead++){
        SnippetFragment sF = {0, 0, 0, 0};
        int iS = 0;
        if( iCol>=0 && iRead!=iCol ) continue;

        /* Find the best snippet of nFToken tokens in column iRead. */
        rc = fts3BestSnippet(nFToken, pCsr, iRead, mCovered, &mSeen, &sF, &iS);
        if( rc!=SQLITE_OK ){
          goto snippet_out;
        }
        if( iS>iBestScore ){
          *pFragment = sF;
          iBestScore = iS;
        }
      }

      mCovered |= pFragment->covered;
    }

    /* If all query phrases seen by fts3BestSnippet() are present in at least
    ** one of the nSnippet snippet fragments, break out of the loop.
    */
    assert( (mCovered&mSeen)==mCovered );
    if( mSeen==mCovered || nSnippet==SizeofArray(aSnippet) ) break;
  }

  assert( nFToken>0 );

  for(i=0; i<nSnippet && rc==SQLITE_OK; i++){
    rc = fts3SnippetText(pCsr, &aSnippet[i], 
        i, (i==nSnippet-1), nFToken, zStart, zEnd, zEllipsis, &res
    );
  }

 snippet_out:
  sqlite3Fts3SegmentsClose(pTab);
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
    sqlite3_free(res.z);
  }else{
    sqlite3_result_text(pCtx, res.z, -1, sqlite3_free);
  }
}